

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

bool __thiscall
dap::Deserializer::deserialize<std::vector<dap::integer,std::allocator<dap::integer>>>
          (Deserializer *this,
          optional<std::vector<dap::integer,_std::allocator<dap::integer>_>_> *opt)

{
  bool bVar1;
  undefined1 local_30 [8];
  vector<dap::integer,_std::allocator<dap::integer>_> v;
  optional<std::vector<dap::integer,_std::allocator<dap::integer>_>_> *opt_local;
  Deserializer *this_local;
  
  v.super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)opt;
  std::vector<dap::integer,_std::allocator<dap::integer>_>::vector
            ((vector<dap::integer,_std::allocator<dap::integer>_> *)local_30);
  bVar1 = deserialize<dap::integer>
                    (this,(vector<dap::integer,_std::allocator<dap::integer>_> *)local_30);
  if (bVar1) {
    optional<std::vector<dap::integer,std::allocator<dap::integer>>>::operator=
              ((optional<std::vector<dap::integer,std::allocator<dap::integer>>> *)
               v.super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
               (vector<dap::integer,_std::allocator<dap::integer>_> *)local_30);
  }
  std::vector<dap::integer,_std::allocator<dap::integer>_>::~vector
            ((vector<dap::integer,_std::allocator<dap::integer>_> *)local_30);
  return true;
}

Assistant:

bool Deserializer::deserialize(dap::optional<T>* opt) const {
  T v;
  if (deserialize(&v)) {
    *opt = v;
  }
  return true;
}